

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateVariableAccess
          (ExpressionContext *ctx,SynBase *source,IntrusiveList<SynIdentifier> path,InplaceStr name,
          bool allowInternal)

{
  FunctionLookupChain chain;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ScopeData *pSVar4;
  ScopeData *pSVar5;
  ScopeData *pSVar6;
  TypeBase *pTVar7;
  IdentifierLookupResult *pIVar8;
  ExprBase *value;
  undefined4 extraout_var;
  SynIdentifier *pSVar10;
  VariableData *variable;
  ScopeData *variable_00;
  long *plVar11;
  bool bVar12;
  InplaceStr local_70;
  Node *local_60;
  Node *pNStack_58;
  ScopeData *local_50;
  FunctionLookupChain local_48;
  SynIdentifier *pSVar9;
  
  pSVar10 = path.head;
  local_70.end = name.end;
  local_70.begin = name.begin;
  uVar2 = NULLC::GetStringHash("");
  pSVar9 = pSVar10;
  while (pSVar9 != (SynIdentifier *)0x0) {
    uVar2 = NULLC::StringHashContinue(uVar2,(pSVar9->name).begin,(pSVar9->name).end);
    uVar2 = NULLC::StringHashContinue(uVar2,".");
    pSVar9 = (SynIdentifier *)(pSVar9->super_SynBase).next;
    if ((pSVar9 == (SynIdentifier *)0x0) || ((pSVar9->super_SynBase).typeID != 4)) {
      pSVar9 = (SynIdentifier *)0x0;
    }
  }
  uVar2 = NULLC::StringHashContinue(uVar2,local_70.begin,local_70.end);
  pSVar4 = (ScopeData *)anon_unknown.dwarf_9fd58::LookupObjectByName(ctx,uVar2);
  if ((pSVar4 == (ScopeData *)0x0) || (pSVar5 = pSVar4->scope, pSVar5 == (ScopeData *)0x0)) {
    pSVar5 = (ScopeData *)0x0;
  }
  bVar12 = true;
  if ((pSVar5 != (ScopeData *)0x0) &&
     (pSVar4 = anon_unknown.dwarf_9fd58::NamedOrGlobalScopeFrom(pSVar4), pSVar4 != ctx->globalScope)
     ) {
    pSVar4 = (ScopeData *)CreateVariableAccess(ctx,source,(VariableData *)pSVar5,true);
    bVar12 = false;
  }
  if (bVar12) {
    pSVar5 = anon_unknown.dwarf_9fd58::NamedOrGlobalScopeFrom(pSVar4);
    while (pSVar5 != (ScopeData *)0x0) {
      pSVar9 = pSVar10;
      if (pSVar5->ownerNamespace == (NamespaceData *)0x0) {
        uVar2 = NULLC::GetStringHash("");
      }
      else {
        uVar2 = NULLC::StringHashContinue(pSVar5->ownerNamespace->fullNameHash,".");
      }
      while (pSVar9 != (SynIdentifier *)0x0) {
        uVar2 = NULLC::StringHashContinue(uVar2,(pSVar9->name).begin,(pSVar9->name).end);
        uVar2 = NULLC::StringHashContinue(uVar2,".");
        pSVar9 = (SynIdentifier *)(pSVar9->super_SynBase).next;
        if ((pSVar9 == (SynIdentifier *)0x0) || ((pSVar9->super_SynBase).typeID != 4)) {
          pSVar9 = (SynIdentifier *)0x0;
        }
      }
      uVar2 = NULLC::StringHashContinue(uVar2,local_70.begin,local_70.end);
      pSVar6 = (ScopeData *)anon_unknown.dwarf_9fd58::LookupObjectByName(ctx,uVar2);
      if ((pSVar6 == (ScopeData *)0x0) ||
         (variable_00 = pSVar6->scope, variable_00 == (ScopeData *)0x0)) {
        variable_00 = (ScopeData *)0x0;
      }
      if (variable_00 != (ScopeData *)0x0) {
        pSVar4 = (ScopeData *)CreateVariableAccess(ctx,source,(VariableData *)variable_00,true);
        break;
      }
      pSVar5 = anon_unknown.dwarf_9fd58::NamedOrGlobalScopeFrom(pSVar6);
    }
    if (pSVar5 == (ScopeData *)0x0) {
      for (pSVar5 = ctx->scope; pSVar5 != (ScopeData *)0x0; pSVar5 = pSVar5->scope) {
        pTVar7 = pSVar5->ownerType;
        if (pTVar7 != (TypeBase *)0x0) goto LAB_0015bef4;
      }
      pTVar7 = (TypeBase *)0x0;
LAB_0015bef4:
      if (((pTVar7 == (TypeBase *)0x0) || (0x19 < pTVar7->typeID)) ||
         ((0x3130000U >> (pTVar7->typeID & 0x1f) & 1) == 0)) {
        pTVar7 = (TypeBase *)0x0;
      }
      if (pTVar7 == (TypeBase *)0x0) {
        bVar12 = true;
      }
      else {
        plVar11 = (long *)pTVar7[1].name.end;
        bVar12 = plVar11 == (long *)0x0;
        if (!bVar12) {
          bVar1 = InplaceStr::operator==((InplaceStr *)(*plVar11 + 0x40),&local_70);
          if (!bVar1) {
            do {
              plVar11 = (long *)plVar11[2];
              bVar12 = plVar11 == (long *)0x0;
              if (bVar12) goto LAB_0015bf7b;
              bVar1 = InplaceStr::operator==((InplaceStr *)(*plVar11 + 0x40),&local_70);
            } while (!bVar1);
          }
          pSVar4 = (ScopeData *)CreateLiteralCopy(ctx,source,(ExprBase *)plVar11[1]);
        }
      }
LAB_0015bf7b:
      if (bVar12) {
        pSVar5 = pSVar4;
        if ((pSVar10 == (SynIdentifier *)0x0) &&
           (pSVar5 = (ScopeData *)anon_unknown.dwarf_9fd58::FindNextTypeFromScope(ctx->scope),
           pSVar5 != (ScopeData *)0x0)) {
          uVar2 = NULLC::GetStringHash("this","");
          pIVar8 = anon_unknown.dwarf_9fd58::LookupObjectByName(ctx,uVar2);
          if ((pIVar8 == (IdentifierLookupResult *)0x0) ||
             (variable = pIVar8->variable, variable == (VariableData *)0x0)) {
            variable = (VariableData *)0x0;
          }
          if (variable == (VariableData *)0x0) {
            bVar12 = true;
            pSVar5 = pSVar4;
          }
          else {
            value = CreateVariableAccess(ctx,source,variable,true);
            iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pSVar9 = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
            (pSVar9->super_SynBase).typeID = 4;
            (pSVar9->super_SynBase).begin = (Lexeme *)0x0;
            (pSVar9->super_SynBase).end = (Lexeme *)0x0;
            (pSVar9->super_SynBase).pos.begin = (char *)0x0;
            (pSVar9->super_SynBase).pos.end = (char *)0x0;
            *(undefined8 *)((long)&(pSVar9->super_SynBase).pos.end + 2) = 0;
            *(undefined8 *)((long)&(pSVar9->super_SynBase).next + 2) = 0;
            (pSVar9->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
            (pSVar9->name).begin = local_70.begin;
            (pSVar9->name).end = local_70.end;
            pSVar6 = (ScopeData *)CreateMemberAccess(ctx,source,value,pSVar9,true);
            bVar12 = pSVar6 == (ScopeData *)0x0;
            pSVar5 = pSVar4;
            if (!bVar12) {
              pSVar5 = pSVar6;
            }
          }
          if (!bVar12) {
            return (ExprBase *)pSVar5;
          }
        }
        pSVar4 = anon_unknown.dwarf_9fd58::NamedOrGlobalScopeFrom(pSVar5);
        if (pSVar4 == (ScopeData *)0x0) {
          local_60 = (Node *)0x0;
          pNStack_58 = (Node *)0x0;
          local_50 = (ScopeData *)0x0;
        }
        else {
          do {
            pSVar9 = pSVar10;
            if (pSVar4->ownerNamespace == (NamespaceData *)0x0) {
              uVar2 = NULLC::GetStringHash("");
            }
            else {
              uVar2 = NULLC::StringHashContinue(pSVar4->ownerNamespace->fullNameHash,".");
            }
            while (pSVar9 != (SynIdentifier *)0x0) {
              uVar2 = NULLC::StringHashContinue(uVar2,(pSVar9->name).begin,(pSVar9->name).end);
              uVar2 = NULLC::StringHashContinue(uVar2,".");
              pSVar9 = (SynIdentifier *)(pSVar9->super_SynBase).next;
              if ((pSVar9 == (SynIdentifier *)0x0) || ((pSVar9->super_SynBase).typeID != 4)) {
                pSVar9 = (SynIdentifier *)0x0;
              }
            }
            uVar2 = NULLC::StringHashContinue(uVar2,local_70.begin,local_70.end);
            pSVar4 = (ScopeData *)
                     anon_unknown.dwarf_9fd58::LookupFunctionChainByName(&local_48,ctx,uVar2);
            local_50 = local_48.scope;
            pNStack_58 = local_48.node.node;
            local_60 = local_48.node.start;
            if (local_48.node.node != (Node *)0x0) {
              if (*(char *)(*(long *)(local_48.node.node + 0x10) + 0x10) == '\x01' && !allowInternal
                 ) {
                local_50 = (ScopeData *)0x0;
                local_60 = (Node *)0x0;
                pNStack_58 = (Node *)0x0;
              }
              break;
            }
            pSVar4 = anon_unknown.dwarf_9fd58::NamedOrGlobalScopeFrom(pSVar4);
          } while (pSVar4 != (ScopeData *)0x0);
        }
        if (pNStack_58 == (Node *)0x0) {
          pSVar4 = (ScopeData *)0x0;
        }
        else {
          chain.node.node = pNStack_58;
          chain.node.start = local_60;
          chain.scope = local_50;
          pSVar4 = (ScopeData *)CreateFunctionAccess(ctx,source,chain,(ExprBase *)0x0);
        }
      }
    }
  }
  return (ExprBase *)pSVar4;
}

Assistant:

ExprBase* CreateVariableAccess(ExpressionContext &ctx, SynBase *source, IntrusiveList<SynIdentifier> path, InplaceStr name, bool allowInternal)
{
	// Check local scope first
	{
		unsigned hash = NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(VariableData *variable = LookupVariableByName(ctx, hash))
		{
			// Must be non-global scope
			if(NamedOrGlobalScopeFrom(variable->scope) != ctx.globalScope)
				return CreateVariableAccess(ctx, source, variable, true);
		}
	}

	// Search for variable starting from current namespace to global scope
	for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
	{
		unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(VariableData *variable = LookupVariableByName(ctx, hash))
			return CreateVariableAccess(ctx, source, variable, true);
	}

	{
		// Try a class constant or an alias
		if(TypeStruct *structType = getType<TypeStruct>(ctx.GetCurrentType(ctx.scope)))
		{
			for(ConstantData *curr = structType->constants.head; curr; curr = curr->next)
			{
				if(curr->name->name == name)
					return CreateLiteralCopy(ctx, source, curr->value);
			}
		}
	}

	if(path.empty())
	{
		if(FindNextTypeFromScope(ctx.scope))
		{
			if(VariableData *variable = LookupVariableByName(ctx, InplaceStr("this").hash()))
			{
				if(ExprBase *member = CreateMemberAccess(ctx, source, CreateVariableAccess(ctx, source, variable, true), new (ctx.get<SynIdentifier>()) SynIdentifier(name), true))
					return member;
			}
		}
	}

	FunctionLookupChain function;

	for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
	{
		unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		function = LookupFunctionChainByName(ctx, hash);

		if(function)
		{
			if(function->isInternal && !allowInternal)
				function = FunctionLookupChain();

			break;
		}
	}

	if(function)
		return CreateFunctionAccess(ctx, source, function, NULL);

	return NULL;
}